

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qiconloader.cpp
# Opt level: O1

QStringList * __thiscall
QIconLoader::fallbackSearchPaths(QStringList *__return_storage_ptr__,QIconLoader *this)

{
  Data *pDVar1;
  QString *pQVar2;
  qsizetype qVar3;
  long in_FS_OFFSET;
  QArrayDataPointer<QString> local_68;
  anon_union_24_3_e3d07ef4_for_data local_48;
  undefined4 uStack_30;
  undefined4 uStack_2c;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if ((this->m_fallbackDirs).d.size != 0) goto LAB_002793bf;
  if (QGuiApplicationPrivate::platform_theme == (QPlatformTheme *)0x0) {
LAB_00279340:
    local_68.d = (Data *)0x0;
    local_68.ptr = (QString *)0x0;
    local_68.size = 0;
  }
  else {
    local_48._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
    uStack_30 = 0xaaaaaaaa;
    uStack_2c = 0xaaaaaaaa;
    local_48.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
    local_48._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    (*QGuiApplicationPrivate::platform_theme->_vptr_QPlatformTheme[0xc])
              (&local_48,QGuiApplicationPrivate::platform_theme,0x23);
    if (CONCAT44(uStack_2c,uStack_30) < 4) {
      ::QVariant::~QVariant((QVariant *)&local_48);
      goto LAB_00279340;
    }
    ::QVariant::toStringList();
    ::QVariant::~QVariant((QVariant *)&local_48);
  }
  qVar3 = local_68.size;
  pQVar2 = local_68.ptr;
  pDVar1 = local_68.d;
  local_68.d = (Data *)0x0;
  local_68.ptr = (QString *)0x0;
  local_68.size = 0;
  local_48.shared = (PrivateShared *)(this->m_fallbackDirs).d.d;
  local_48._8_8_ = (this->m_fallbackDirs).d.ptr;
  (this->m_fallbackDirs).d.d = pDVar1;
  (this->m_fallbackDirs).d.ptr = pQVar2;
  local_48._16_8_ = (this->m_fallbackDirs).d.size;
  (this->m_fallbackDirs).d.size = qVar3;
  QArrayDataPointer<QString>::~QArrayDataPointer((QArrayDataPointer<QString> *)&local_48);
  QArrayDataPointer<QString>::~QArrayDataPointer(&local_68);
LAB_002793bf:
  pDVar1 = (this->m_fallbackDirs).d.d;
  (__return_storage_ptr__->d).d = pDVar1;
  (__return_storage_ptr__->d).ptr = (this->m_fallbackDirs).d.ptr;
  (__return_storage_ptr__->d).size = (this->m_fallbackDirs).d.size;
  if (pDVar1 != (Data *)0x0) {
    LOCK();
    (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QStringList QIconLoader::fallbackSearchPaths() const
{
    if (m_fallbackDirs.isEmpty()) {
        m_fallbackDirs = systemFallbackSearchPaths();
    }
    return m_fallbackDirs;
}